

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_create_tcd(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                           opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_tcd_t *p_tcd;
  OPJ_BOOL OVar2;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2f58,
                  "OPJ_BOOL opj_j2k_create_tcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream != (opj_stream_private_t *)0x0) {
      OVar2 = 0;
      p_tcd = opj_tcd_create(0);
      p_j2k->m_tcd = p_tcd;
      if (p_tcd == (opj_tcd_t *)0x0) {
        opj_event_msg(p_manager,1,"Not enough memory to create Tile Coder\n");
      }
      else {
        OVar1 = opj_tcd_init(p_tcd,p_j2k->m_private_image,&p_j2k->m_cp,p_j2k->m_tp);
        OVar2 = 1;
        if (OVar1 == 0) {
          opj_tcd_destroy(p_j2k->m_tcd);
          p_j2k->m_tcd = (opj_tcd *)0x0;
          OVar2 = 0;
        }
      }
      return OVar2;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2f5a,
                  "OPJ_BOOL opj_j2k_create_tcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x2f59,
                "OPJ_BOOL opj_j2k_create_tcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_create_tcd(opj_j2k_t *p_j2k,
                                   opj_stream_private_t *p_stream,
                                   opj_event_mgr_t * p_manager
                                  )
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);

    p_j2k->m_tcd = opj_tcd_create(OPJ_FALSE);

    if (! p_j2k->m_tcd) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to create Tile Coder\n");
        return OPJ_FALSE;
    }

    if (!opj_tcd_init(p_j2k->m_tcd, p_j2k->m_private_image, &p_j2k->m_cp,
                      p_j2k->m_tp)) {
        opj_tcd_destroy(p_j2k->m_tcd);
        p_j2k->m_tcd = 00;
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}